

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O0

MtrNode * Mtr_InitTree(void)

{
  MtrNode *node;
  
  node = Mtr_AllocNode();
  if (node == (MtrNode *)0x0) {
    node = (MtrNode *)0x0;
  }
  else {
    node->younger = (MtrNode *)0x0;
    node->elder = (MtrNode *)0x0;
    node->child = (MtrNode *)0x0;
    node->parent = (MtrNode *)0x0;
    node->flags = 0;
  }
  return node;
}

Assistant:

MtrNode *
Mtr_InitTree(void)
{
    MtrNode *node;

    node = Mtr_AllocNode();
    if (node == NULL) return(NULL);

    node->parent = node->child = node->elder = node->younger = NULL;
    node->flags = 0;

    return(node);

}